

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int uv__io_fork(uv_loop_t *loop)

{
  void *old_watchers_00;
  void *old_watchers;
  int err;
  uv_loop_t *loop_local;
  
  old_watchers_00 = loop->inotify_watchers;
  uv__close(loop->backend_fd);
  loop->backend_fd = -1;
  uv__platform_loop_delete(loop);
  loop_local._4_4_ = uv__platform_loop_init(loop);
  if (loop_local._4_4_ == 0) {
    loop_local._4_4_ = uv__inotify_fork(loop,old_watchers_00);
  }
  return loop_local._4_4_;
}

Assistant:

int uv__io_fork(uv_loop_t* loop) {
  int err;
  void* old_watchers;

  old_watchers = loop->inotify_watchers;

  uv__close(loop->backend_fd);
  loop->backend_fd = -1;
  uv__platform_loop_delete(loop);

  err = uv__platform_loop_init(loop);
  if (err)
    return err;

  return uv__inotify_fork(loop, old_watchers);
}